

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

void __thiscall OpenMD::Snapshot::setHmat(Snapshot *this,Mat3x3d *m)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint i;
  long lVar3;
  bool bVar4;
  Mat3x3d *pMVar5;
  uint j;
  long lVar6;
  bool bVar7;
  Mat3x3d *this_00;
  double dVar8;
  double dVar9;
  SquareMatrix3<double> local_60;
  
  this->hasVolume = false;
  this_00 = &(this->frameData).hmat;
  if (this_00 != m) {
    lVar3 = 0;
    pMVar5 = this_00;
    do {
      lVar6 = 0;
      do {
        (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar6] =
             (((SquareMatrix<double,_3> *)*(double (*) [3])m)->super_RectMatrix<double,_3U,_3U>).
             data_[0][lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar3 = lVar3 + 1;
      pMVar5 = (Mat3x3d *)
               ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
      m = (Mat3x3d *)((long)m + 0x18);
    } while (lVar3 != 3);
  }
  SquareMatrix3<double>::inverse(&local_60,this_00);
  pMVar5 = &(this->frameData).invHmat;
  if (pMVar5 != &local_60) {
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)(this->frameData).invHmat.super_SquareMatrix<double,_3>.
              super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 + 0x10) =
           *(undefined8 *)
            ((long)local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar3 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar3 + 8);
      puVar1 = (undefined8 *)
               ((long)(pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar3);
      *puVar1 = *(undefined8 *)
                 ((long)local_60.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar3);
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
  }
  dVar8 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0][0]);
  dVar9 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[1][1]);
  if (dVar8 <= dVar9) {
    dVar9 = dVar8;
  }
  dVar8 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[2][2]);
  if (dVar9 <= dVar8) {
    dVar8 = dVar9;
  }
  dVar9 = this->orthoTolerance_;
  (this->frameData).orthoRhombic = true;
  lVar3 = 0;
  bVar7 = true;
  do {
    lVar6 = 0;
    bVar4 = bVar7;
    do {
      if (((lVar3 != lVar6) && (bVar7)) &&
         (dVar8 * dVar9 <=
          ABS((this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar6]))) {
        (this->frameData).orthoRhombic = false;
        bVar4 = false;
        bVar7 = false;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar3 = lVar3 + 1;
    this_00 = (Mat3x3d *)
              ((this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    bVar7 = bVar4;
  } while (lVar3 != 3);
  return;
}

Assistant:

void Snapshot::setHmat(const Mat3x3d& m) {
    hasVolume         = false;
    frameData.hmat    = m;
    frameData.invHmat = frameData.hmat.inverse();

    // determine whether the box is orthoTolerance or not
    bool oldOrthoRhombic = frameData.orthoRhombic;

    RealType smallDiag = fabs(frameData.hmat(0, 0));
    if (smallDiag > fabs(frameData.hmat(1, 1)))
      smallDiag = fabs(frameData.hmat(1, 1));
    if (smallDiag > fabs(frameData.hmat(2, 2)))
      smallDiag = fabs(frameData.hmat(2, 2));
    RealType tol = smallDiag * orthoTolerance_;

    frameData.orthoRhombic = true;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        if (i != j) {
          if (frameData.orthoRhombic) {
            if (fabs(frameData.hmat(i, j)) >= tol)
              frameData.orthoRhombic = false;
          }
        }
      }
    }

    if (oldOrthoRhombic != frameData.orthoRhombic) {
      // It is finally time to suppress these warnings once and for
      // all.  They were annoying and not very informative.

      // if( frameData.orthoRhombic ) {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the default Non-Orthorhombic\n"
      //   	 "\tto the faster Orthorhombic periodic boundary
      //   computations.\n"
      //   	 "\tThis is usually a good thing, but if you want the\n"
      //   	 "\tNon-Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) smaller.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_INFO;
      //   simError();
      // }
      // else {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the faster Orthorhombic to the
      //   more\n"
      //   	 "\tflexible Non-Orthorhombic periodic boundary computations.\n"
      //   	 "\tThis is usually because the box has deformed under\n"
      //   	 "\tNPTf integration. If you want to live on the edge with\n"
      //   	 "\tthe Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) larger.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_WARNING;
      //   simError();
      // }
    }
  }